

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O1

void slang::mul(uint64_t *dst,uint64_t *x,uint32_t xlen,uint64_t *y,uint32_t ylen)

{
  size_t __n;
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint32_t uVar10;
  uint xlen_00;
  uint ylen_00;
  uint64_t *puVar11;
  uint64_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint ylen_01;
  uint64_t uVar15;
  uint uVar16;
  uint32_t xlen_01;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  TempBuffer<unsigned_long,_128UL> t2;
  TempBuffer<unsigned_long,_128UL> t1;
  uint64_t local_c50 [128];
  uint64_t *local_850;
  ulong local_848;
  uint64_t local_840 [128];
  uint64_t *local_440;
  ulong local_438;
  uint64_t local_430 [128];
  
  uVar14 = (ulong)ylen;
  uVar7 = (ulong)xlen;
  if (ylen < 8 || xlen < 8) {
    if (xlen == 0) {
      uVar15 = 0;
    }
    else {
      uVar19 = *y;
      uVar18 = 0;
      uVar15 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar15;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar19;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = x[uVar18];
        auVar8 = auVar3 * auVar5 + auVar8;
        uVar15 = auVar8._8_8_;
        dst[uVar18] = auVar8._0_8_;
        uVar18 = uVar18 + 1;
      } while (uVar7 != uVar18);
    }
    dst[uVar7] = uVar15;
    if (1 < ylen) {
      uVar19 = 1;
      do {
        if (xlen == 0) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          uVar15 = 0;
          do {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar15;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = y[uVar19];
            auVar6._8_8_ = 0;
            auVar6._0_8_ = x[uVar18];
            auVar9 = auVar4 * auVar6 + auVar9;
            uVar13 = auVar9._0_8_;
            puVar1 = dst + (uint)((int)uVar19 + (int)uVar18);
            uVar2 = *puVar1;
            *puVar1 = *puVar1 + uVar13;
            uVar15 = auVar9._8_8_ + (ulong)CARRY8(uVar2,uVar13);
            uVar18 = uVar18 + 1;
          } while (uVar7 != uVar18);
        }
        dst[(int)uVar19 + xlen] = uVar15;
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar14);
    }
  }
  else {
    puVar12 = y;
    uVar10 = xlen;
    if (ylen < xlen) {
      puVar12 = x;
      x = y;
      uVar14 = uVar7;
      uVar10 = ylen;
    }
    uVar7 = uVar14 >> 1;
    ylen_01 = (uint)uVar7;
    uVar19 = (ulong)uVar10;
    if (ylen_01 < uVar10) {
      uVar19 = uVar7;
    }
    xlen_01 = (uint32_t)uVar19;
    xlen_00 = uVar10 - xlen_01;
    ylen_00 = (uint)uVar14 - ylen_01;
    uVar16 = ylen + xlen;
    uVar18 = (ulong)uVar16;
    local_848 = uVar18;
    if (uVar16 < 0x81) {
      puVar11 = local_840;
    }
    else {
      puVar11 = (uint64_t *)operator_new__(uVar18 * 8);
    }
    __n = uVar18 * 8;
    local_850 = puVar11;
    memset(puVar11,0,__n);
    mul(puVar11,x + uVar19,xlen_00,puVar12 + uVar7,ylen_00);
    memset(dst,0,__n);
    memcpy(dst + ((uint)uVar14 & 0xfffffffe),local_850,(ulong)(ylen_00 + xlen_00) << 3);
    if (uVar16 < 0x81) {
      puVar11 = local_c50;
    }
    else {
      puVar11 = (uint64_t *)operator_new__(__n);
    }
    memset(puVar11,0,__n);
    mul(puVar11,x,xlen_01,puVar12,ylen_01);
    memcpy(dst,puVar11,(ulong)(xlen_01 + ylen_01) << 3);
    uVar17 = uVar16 - ylen_01;
    if (uVar17 != 0) {
      uVar14 = 0;
      bVar20 = false;
      do {
        puVar1 = dst + uVar7 + uVar14;
        uVar2 = (ulong)bVar20;
        uVar13 = *puVar1 - puVar11[uVar14];
        bVar20 = *puVar1 < puVar11[uVar14] || uVar13 < uVar2;
        *puVar1 = uVar13 - uVar2;
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
    }
    if (uVar16 != ylen_01) {
      uVar14 = 0;
      bVar20 = false;
      do {
        puVar1 = dst + uVar7 + uVar14;
        uVar2 = (ulong)bVar20;
        uVar13 = *puVar1 - local_850[uVar14];
        bVar20 = *puVar1 < local_850[uVar14] || uVar13 < uVar2;
        *puVar1 = uVar13 - uVar2;
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
    }
    memset(local_850,0,local_848 << 3);
    unevenAdd(local_850,x + uVar19,xlen_00,x,xlen_01);
    memset(puVar11,0,uVar18 << 3);
    unevenAdd(puVar11,puVar12 + uVar7,ylen_00,puVar12,ylen_01);
    local_438 = uVar18;
    if (uVar16 < 0x81) {
      puVar12 = local_430;
    }
    else {
      puVar12 = (uint64_t *)operator_new__(__n);
    }
    local_440 = puVar12;
    memset(puVar12,0,__n);
    if (xlen_00 < xlen_01) {
      xlen_00 = xlen_01;
    }
    if (ylen_00 < ylen_01) {
      ylen_00 = ylen_01;
    }
    mul(puVar12,local_850,xlen_00 + 1,puVar11,ylen_00 + 1);
    if (uVar16 != ylen_01) {
      uVar14 = 0;
      bVar20 = false;
      do {
        puVar1 = dst + uVar7 + uVar14;
        uVar19 = (ulong)bVar20;
        uVar2 = *puVar1 + local_440[uVar14];
        bVar20 = CARRY8(*puVar1,local_440[uVar14]) || CARRY8(uVar2,uVar19);
        *puVar1 = uVar2 + uVar19;
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
    }
    if (local_440 != (uint64_t *)0x0 && 0x80 < local_438) {
      operator_delete__(local_440);
    }
    if ((0x80 < uVar18) && (puVar11 != (uint64_t *)0x0)) {
      operator_delete__(puVar11);
    }
    if ((0x80 < local_848) && (local_850 != (uint64_t *)0x0)) {
      operator_delete__(local_850);
    }
  }
  return;
}

Assistant:

static void mul(uint64_t* dst, const uint64_t* x, uint32_t xlen, const uint64_t* y, uint32_t ylen) {
    if (xlen > 7 && ylen > 7) {
        mulKaratsuba(dst, x, xlen, y, ylen);
        return;
    }

    dst[xlen] = mulOne(dst, x, xlen, y[0]);
    for (uint32_t i = 1; i < ylen; i++) {
        uint64_t carry = 0;
        for (uint32_t j = 0; j < xlen; j++) {
            calc_out_t result;
            uint8_t c = addcarry64(0, mulTerm(x[j], y[i], carry), dst[i + j], &result);

            dst[i + j] = result;
            carry += c;
        }
        dst[i + xlen] = carry;
    }
}